

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_seek_wal_only_test(void)

{
  void *pvVar1;
  void *pvVar2;
  fdb_doc *pfVar3;
  fdb_doc *pfVar4;
  fdb_iterator *pfVar5;
  fdb_kvs_handle *handle;
  fdb_status fVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  char *__format;
  long lVar12;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv1;
  fdb_doc *local_4a8 [4];
  long local_488;
  long local_468;
  long local_460;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char keybuf [256];
  char metabuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./iterator_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar6 = fdb_set_log_callback(db,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc3c);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc3c,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_kvs_open(dbfile,&kv1,"kv1",&kvs_config);
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc40);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc40,"void iterator_seek_wal_only_test()");
  }
  lVar12 = 0;
  for (uVar11 = 0; uVar11 != 10; uVar11 = uVar11 + 1) {
    sprintf(keybuf,"kEy%d",uVar11 & 0xffffffff);
    sprintf(metabuf,"mEta%d",uVar11 & 0xffffffff);
    sprintf(bodybuf,"bOdy%d",uVar11 & 0xffffffff);
    sVar8 = strlen(keybuf);
    sVar9 = strlen(metabuf);
    sVar10 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_4a8 + lVar12),keybuf,sVar8,metabuf,sVar9,bodybuf,sVar10)
    ;
    fVar6 = fdb_set(kv1,local_4a8[uVar11]);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xc4a);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xc4a,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free(local_4a8[uVar11]);
    lVar12 = lVar12 + 8;
  }
  lVar12 = 0;
  for (uVar11 = 0; uVar11 != 10; uVar11 = uVar11 + 1) {
    sprintf(keybuf,"key%d",uVar11 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar11 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar11 & 0xffffffff);
    sVar8 = strlen(keybuf);
    sVar9 = strlen(metabuf);
    sVar10 = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_4a8 + lVar12),keybuf,sVar8,metabuf,sVar9,bodybuf,sVar10)
    ;
    fdb_set(db,local_4a8[uVar11]);
    lVar12 = lVar12 + 8;
  }
  fdb_commit(dbfile,'\0');
  fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
  fVar6 = fdb_iterator_get(iterator,&rdoc);
  pfVar3 = local_4a8[0];
  pfVar4 = rdoc;
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc5f);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc5f,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = rdoc->key;
  pvVar2 = local_4a8[0]->key;
  iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc61);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc61,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->meta;
  pvVar2 = pfVar3->meta;
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc62);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc62,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->body;
  pvVar2 = pfVar3->body;
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc63);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc63,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free(pfVar4);
  pfVar5 = iterator;
  rdoc = (fdb_doc *)0x0;
  pvVar1 = *(void **)((long)local_4a8[2] + 0x20);
  sVar8 = strlen(keybuf);
  fVar6 = fdb_iterator_seek(pfVar5,pvVar1,sVar8,'\0');
  if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6a);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc6a,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_iterator_get(iterator,&rdoc);
  pfVar3 = local_4a8[2];
  pfVar4 = rdoc;
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6c);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc6c,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = rdoc->key;
  pvVar2 = *(void **)((long)local_4a8[2] + 0x20);
  iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6e);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc6e,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->meta;
  pvVar2 = *(void **)((long)pfVar3 + 0x38);
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc6f);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc6f,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->body;
  pvVar2 = *(void **)((long)pfVar3 + 0x40);
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc70);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc70,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free(pfVar4);
  rdoc = (fdb_doc *)0x0;
  fVar6 = fdb_iterator_next(iterator);
  if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc76);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc76,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_iterator_get(iterator,&rdoc);
  pfVar3 = local_4a8[3];
  pfVar4 = rdoc;
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc78);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc78,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = rdoc->key;
  pvVar2 = *(void **)((long)local_4a8[3] + 0x20);
  iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc7b);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc7b,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->meta;
  pvVar2 = *(void **)((long)pfVar3 + 0x38);
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc7c);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc7c,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->body;
  pvVar2 = *(void **)((long)pfVar3 + 0x40);
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc7d);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc7d,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free(pfVar4);
  pfVar5 = iterator;
  rdoc = (fdb_doc *)0x0;
  pvVar1 = *(void **)(local_460 + 0x20);
  sVar8 = strlen(keybuf);
  fVar6 = fdb_iterator_seek(pfVar5,pvVar1,sVar8,'\0');
  if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc83);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc83,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_iterator_get(iterator,&rdoc);
  lVar12 = local_460;
  pfVar4 = rdoc;
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc85);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc85,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = rdoc->key;
  pvVar2 = *(void **)(local_460 + 0x20);
  iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc87);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc87,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->meta;
  pvVar2 = *(void **)(lVar12 + 0x38);
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc88);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc88,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->body;
  pvVar2 = *(void **)(lVar12 + 0x40);
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc89);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc89,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free(pfVar4);
  pfVar5 = iterator;
  rdoc = (fdb_doc *)0x0;
  pvVar1 = local_4a8[0]->key;
  sVar8 = strlen(keybuf);
  fVar6 = fdb_iterator_seek(pfVar5,pvVar1,sVar8,'\0');
  if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc90);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc90,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_iterator_get(iterator,&rdoc);
  pfVar3 = local_4a8[0];
  pfVar4 = rdoc;
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc92);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc92,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = rdoc->key;
  pvVar2 = local_4a8[0]->key;
  iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc94);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc94,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->meta;
  pvVar2 = pfVar3->meta;
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc95);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc95,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = pfVar4->body;
  pvVar2 = pfVar3->body;
  iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
  if (iVar7 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc96);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc96,"void iterator_seek_wal_only_test()");
  }
  fdb_doc_free(pfVar4);
  pfVar5 = iterator;
  rdoc = (fdb_doc *)0x0;
  pvVar1 = *(void **)((long)local_4a8[2] + 0x20);
  sVar8 = strlen(keybuf);
  fVar6 = fdb_iterator_seek(pfVar5,pvVar1,sVar8,'\0');
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xc9c);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xc9c,"void iterator_seek_wal_only_test()");
  }
  lVar12 = 2;
  do {
    fVar6 = fdb_iterator_get(iterator,&rdoc);
    pfVar4 = rdoc;
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca1);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca1,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = rdoc->key;
    pfVar3 = local_4a8[lVar12];
    pvVar2 = pfVar3->key;
    iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca3);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca3,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->meta;
    pvVar2 = pfVar3->meta;
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca4);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca4,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->body;
    pvVar2 = pfVar3->body;
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xca5);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xca5,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    lVar12 = lVar12 + 1;
    fVar6 = fdb_iterator_next(iterator);
    pfVar5 = iterator;
  } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
  if (lVar12 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcab);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("i==10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcab,"void iterator_seek_wal_only_test()");
  }
  pvVar1 = *(void **)((long)local_4a8[3] + 0x20);
  sVar8 = strlen(keybuf);
  fVar6 = fdb_iterator_seek(pfVar5,pvVar1,sVar8,'\0');
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcaf);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcaf,"void iterator_seek_wal_only_test()");
  }
  lVar12 = 3;
  do {
    fVar6 = fdb_iterator_get(iterator,&rdoc);
    pfVar4 = rdoc;
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb4);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb4,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = rdoc->key;
    pfVar3 = local_4a8[lVar12];
    pvVar2 = pfVar3->key;
    iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb6);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb6,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->meta;
    pvVar2 = pfVar3->meta;
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb7);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb7,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->body;
    pvVar2 = pfVar3->body;
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcb8);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcb8,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    lVar12 = lVar12 + 1;
    fVar6 = fdb_iterator_next(iterator);
  } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
  if (lVar12 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcbe);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("i==10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcbe,"void iterator_seek_wal_only_test()");
  }
  fdb_iterator_close(iterator);
  sprintf(keybuf,"key%d",4);
  sprintf(metabuf,"key%d",8);
  handle = db;
  sVar8 = strlen(keybuf);
  sVar9 = strlen(metabuf);
  fVar6 = fdb_iterator_init(handle,&iterator,keybuf,sVar8,metabuf,sVar9,2);
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcc9);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcc9,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_iterator_seek_to_max(iterator);
  if (fVar6 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xccc);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xccc,"void iterator_seek_wal_only_test()");
  }
  fVar6 = fdb_iterator_get(iterator,&rdoc);
  pfVar4 = rdoc;
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pvVar1 = rdoc->key;
    pvVar2 = *(void **)(local_468 + 0x20);
    iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcd0);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcd0,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->meta;
    pvVar2 = *(void **)(local_468 + 0x38);
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcd1);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcd1,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->body;
    pvVar2 = *(void **)(local_468 + 0x40);
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcd2);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcd2,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    fVar6 = fdb_iterator_seek_to_min(iterator);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcd9);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcd9,"void iterator_seek_wal_only_test()");
    }
    fVar6 = fdb_iterator_get(iterator,&rdoc);
    pfVar4 = rdoc;
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcdb);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcdb,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = rdoc->key;
    pvVar2 = *(void **)(local_488 + 0x20);
    iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcdd);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcdd,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->meta;
    pvVar2 = *(void **)(local_488 + 0x38);
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcde);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcde,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->body;
    pvVar2 = *(void **)(local_488 + 0x40);
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcdf);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcdf,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    fVar6 = fdb_iterator_close(iterator);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xce4);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xce4,"void iterator_seek_wal_only_test()");
    }
    fVar6 = fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xce8);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xce8,"void iterator_seek_wal_only_test()");
    }
    fVar6 = fdb_iterator_seek_to_max(iterator);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcec);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcec,"void iterator_seek_wal_only_test()");
    }
    fVar6 = fdb_iterator_get(iterator,&rdoc);
    pfVar4 = rdoc;
    if (fVar6 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcee);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcee,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = rdoc->key;
    pvVar2 = *(void **)(local_460 + 0x20);
    iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcf0);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcf0,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->meta;
    pvVar2 = *(void **)(local_460 + 0x38);
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcf1);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcf1,"void iterator_seek_wal_only_test()");
    }
    pvVar1 = pfVar4->body;
    pvVar2 = *(void **)(local_460 + 0x40);
    iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcf2);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcf2,"void iterator_seek_wal_only_test()");
    }
    fdb_doc_free(pfVar4);
    rdoc = (fdb_doc *)0x0;
    fVar6 = fdb_iterator_seek_to_min(iterator);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      fVar6 = fdb_iterator_get(iterator,&rdoc);
      pfVar4 = rdoc;
      if (fVar6 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xcfb);
        iterator_seek_wal_only_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xcfb,"void iterator_seek_wal_only_test()");
      }
      pvVar1 = rdoc->key;
      pvVar2 = local_4a8[0]->key;
      iVar7 = bcmp(pvVar1,pvVar2,rdoc->keylen);
      if (iVar7 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xcfd);
        iterator_seek_wal_only_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xcfd,"void iterator_seek_wal_only_test()");
      }
      pvVar1 = pfVar4->meta;
      pvVar2 = local_4a8[0]->meta;
      iVar7 = bcmp(pvVar1,pvVar2,pfVar4->metalen);
      if (iVar7 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xcfe);
        iterator_seek_wal_only_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xcfe,"void iterator_seek_wal_only_test()");
      }
      pvVar1 = pfVar4->body;
      pvVar2 = local_4a8[0]->body;
      iVar7 = bcmp(pvVar1,pvVar2,pfVar4->bodylen);
      if (iVar7 == 0) {
        fdb_doc_free(pfVar4);
        rdoc = (fdb_doc *)0x0;
        fVar6 = fdb_iterator_close(iterator);
        if (fVar6 == FDB_RESULT_SUCCESS) {
          fdb_kvs_close(kv1);
          fdb_kvs_close(db);
          fdb_close(dbfile);
          for (lVar12 = 0; lVar12 != 10; lVar12 = lVar12 + 1) {
            fdb_doc_free(local_4a8[lVar12]);
          }
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (iterator_seek_wal_only_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"iterator seek wal only test");
          return;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xd04);
        iterator_seek_wal_only_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xd04,"void iterator_seek_wal_only_test()");
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar2,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xcff);
      iterator_seek_wal_only_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xcff,"void iterator_seek_wal_only_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xcf9);
    iterator_seek_wal_only_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xcf9,"void iterator_seek_wal_only_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xcce);
  iterator_seek_wal_only_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xcce,"void iterator_seek_wal_only_test()");
}

Assistant:

void iterator_seek_wal_only_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_wal_only_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert all documents into WAL only
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek wal only test");
}